

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessage.hpp
# Opt level: O2

ssize_t __thiscall
cppassert::internal::PointerHelper<void>::write
          (PointerHelper<void> *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<(this->stream_,"0x");
  poVar2 = std::operator<<(poVar2,0x30);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x10;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  return (ssize_t)this->stream_;
}

Assistant:

std::ostream& write(void const *pointer) 
        {
            std::uintptr_t value = reinterpret_cast<std::uintptr_t>(pointer);
            (*stream_)<<"0x"
                <<std::setfill ('0') << std::setw(sizeof(void const *)*2)
                <<std::hex
                <<value;
                         
            return (*stream_);
        }